

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

HT_ErrorCode ht_stack_init(HT_Stack *stack,size_t capacity,size_t n_capacity)

{
  HT_ErrorCode HVar1;
  void *pvVar2;
  
  pvVar2 = ht_alloc(capacity);
  stack->data = pvVar2;
  if (pvVar2 == (void *)0x0) {
    HVar1 = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    HVar1 = ht_bag_void_ptr_init(&stack->sizes_stack,n_capacity);
    if (HVar1 == HT_ERR_OK) {
      stack->size = 0;
      stack->capacity = capacity;
      stack->min_capacity = capacity;
      HVar1 = HT_ERR_OK;
    }
    else {
      ht_free(stack->data);
    }
  }
  return HVar1;
}

Assistant:

HT_ErrorCode ht_stack_init(HT_Stack* stack, size_t capacity, size_t n_capacity)
{
    HT_ErrorCode bag_init_err = HT_ERR_OK;

    stack->data = ht_alloc(capacity);

    if (stack->data == NULL)
    {
        return HT_ERR_OUT_OF_MEMORY;
    }

    bag_init_err = ht_bag_void_ptr_init(&stack->sizes_stack, n_capacity);
    if (bag_init_err != HT_ERR_OK)
    {
        ht_free(stack->data);
        return bag_init_err;
    }

    stack->size = 0;
    stack->capacity = capacity;
    stack->min_capacity = capacity;

    return HT_ERR_OK;
}